

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O3

void __thiscall
ManySubcommands_Unlimited_Test::~ManySubcommands_Unlimited_Test
          (ManySubcommands_Unlimited_Test *this)

{
  (this->super_ManySubcommands).super_TApp.super_Test._vptr_Test = (_func_int **)&PTR__TApp_00177178
  ;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->super_ManySubcommands).super_TApp.args);
  CLI::App::~App(&(this->super_ManySubcommands).super_TApp.app);
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(ManySubcommands, Unlimited) {
    run();
    EXPECT_EQ(app.remaining(true), vs_t());

    app.reset();
    app.require_subcommand();

    run();
    EXPECT_EQ(app.remaining(true), vs_t());

    app.reset();
    app.require_subcommand(2, 0); // 2 or more

    run();
    EXPECT_EQ(app.remaining(true), vs_t());
}